

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O2

ImagePyramid * aom_alloc_pyramid(int width,int height,_Bool image_is_16bit)

{
  long lVar1;
  uint uVar2;
  pthread_mutex_t *__mutex;
  void *pvVar3;
  pthread_mutex_t *memblk;
  long lVar4;
  ulong uVar5;
  size_t size;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong num;
  
  uVar8 = height;
  if (width < height) {
    uVar8 = width;
  }
  uVar2 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar8 = 4;
  if (4 < uVar2) {
    uVar8 = uVar2;
  }
  __mutex = (pthread_mutex_t *)aom_calloc(1,0x40);
  if (__mutex == (pthread_mutex_t *)0x0) {
    return (ImagePyramid *)0x0;
  }
  num = (ulong)(uVar8 - 3);
  pvVar3 = aom_calloc(num,0x18);
  *(void **)((long)__mutex + 0x38) = pvVar3;
  memblk = __mutex;
  if (pvVar3 != (void *)0x0) {
    __mutex[1].__data.__lock = uVar8 - 3;
    *(undefined4 *)((long)__mutex + 0x2c) = 0;
    memblk = (pthread_mutex_t *)aom_calloc(num,8);
    if (memblk == (pthread_mutex_t *)0x0) {
      aom_free(*(void **)((long)__mutex + 0x38));
      memblk = __mutex;
    }
    else {
      uVar10 = (ulong)!image_is_16bit;
      lVar4 = uVar10 * 3 + 2;
      size = 0x10;
      for (uVar5 = uVar10; uVar5 < num; uVar5 = uVar5 + 1) {
        lVar1 = *(long *)((long)__mutex + 0x38);
        iVar6 = width >> ((byte)uVar5 & 0x1f);
        iVar7 = height >> ((byte)uVar5 & 0x1f);
        uVar8 = iVar6 + 0x3fU & 0xffffffe0;
        lVar9 = (long)(int)(uVar8 << 4) + size;
        size = size + (long)(int)((iVar7 + 0x20) * uVar8);
        *(long *)((long)memblk + uVar5 * 8) = lVar9 + 0x10;
        *(int *)(lVar1 + -8 + lVar4 * 8) = iVar6;
        *(int *)(lVar1 + -4 + lVar4 * 8) = iVar7;
        *(uint *)(lVar1 + lVar4 * 8) = uVar8;
        lVar4 = lVar4 + 3;
      }
      pvVar3 = aom_memalign(0x20,size);
      *(void **)((long)__mutex + 0x30) = pvVar3;
      if (pvVar3 != (void *)0x0) {
        lVar4 = uVar10 * 0x18;
        for (; uVar10 < num; uVar10 = uVar10 + 1) {
          *(long *)(*(long *)((long)__mutex + 0x38) + lVar4) =
               *(long *)((long)memblk + uVar10 * 8) + (long)pvVar3;
          lVar4 = lVar4 + 0x18;
        }
        pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
        goto LAB_0024db33;
      }
      aom_free(*(void **)((long)__mutex + 0x38));
      aom_free(__mutex);
    }
  }
  __mutex = (pthread_mutex_t *)0x0;
LAB_0024db33:
  aom_free(memblk);
  return (ImagePyramid *)__mutex;
}

Assistant:

ImagePyramid *aom_alloc_pyramid(int width, int height, bool image_is_16bit) {
  // Allocate the maximum possible number of layers for this width and height
  const int msb = get_msb(AOMMIN(width, height));
  const int n_levels = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);

  ImagePyramid *pyr = aom_calloc(1, sizeof(*pyr));
  if (!pyr) {
    return NULL;
  }

  pyr->layers = aom_calloc(n_levels, sizeof(*pyr->layers));
  if (!pyr->layers) {
    aom_free(pyr);
    return NULL;
  }

  pyr->max_levels = n_levels;
  pyr->filled_levels = 0;

  // Compute sizes and offsets for each pyramid level
  // These are gathered up first, so that we can allocate all pyramid levels
  // in a single buffer
  size_t buffer_size = 0;
  size_t *layer_offsets = aom_calloc(n_levels, sizeof(*layer_offsets));
  if (!layer_offsets) {
    aom_free(pyr->layers);
    aom_free(pyr);
    return NULL;
  }

  // Work out if we need to allocate a few extra bytes for alignment.
  // aom_memalign() will ensure that the start of the allocation is aligned
  // to a multiple of PYRAMID_ALIGNMENT. But we want the first image pixel
  // to be aligned, not the first byte of the allocation.
  //
  // In the loop below, we ensure that the stride of every image is a multiple
  // of PYRAMID_ALIGNMENT. Thus the allocated size of each pyramid level will
  // also be a multiple of PYRAMID_ALIGNMENT. Thus, as long as we can get the
  // first pixel in the first pyramid layer aligned properly, that will
  // automatically mean that the first pixel of every row of every layer is
  // properly aligned too.
  //
  // Thus all we need to consider is the first pixel in the first layer.
  // This is located at offset
  //   extra_bytes + level_stride * PYRAMID_PADDING + PYRAMID_PADDING
  // bytes into the buffer. Since level_stride is a multiple of
  // PYRAMID_ALIGNMENT, we can ignore that. So we need
  //   extra_bytes + PYRAMID_PADDING = multiple of PYRAMID_ALIGNMENT
  //
  // To solve this, we can round PYRAMID_PADDING up to the next multiple
  // of PYRAMID_ALIGNMENT, then subtract the orginal value to calculate
  // how many extra bytes are needed.
  size_t first_px_offset =
      (PYRAMID_PADDING + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);
  size_t extra_bytes = first_px_offset - PYRAMID_PADDING;
  buffer_size += extra_bytes;

  // If the original image is stored in an 8-bit buffer, then we can point the
  // lowest pyramid level at that buffer rather than allocating a new one.
  int first_allocated_level = image_is_16bit ? 0 : 1;

  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];

    int level_width = width >> level;
    int level_height = height >> level;

    // Allocate padding for each layer
    int padded_width = level_width + 2 * PYRAMID_PADDING;
    int padded_height = level_height + 2 * PYRAMID_PADDING;

    // Align the layer stride to be a multiple of PYRAMID_ALIGNMENT
    // This ensures that, as long as the top-left pixel in this pyramid level is
    // properly aligned, then so will the leftmost pixel in every row of the
    // pyramid level.
    int level_stride =
        (padded_width + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);

    size_t level_alloc_start = buffer_size;
    size_t level_start =
        level_alloc_start + PYRAMID_PADDING * level_stride + PYRAMID_PADDING;

    buffer_size += level_stride * padded_height;

    layer_offsets[level] = level_start;
    layer->width = level_width;
    layer->height = level_height;
    layer->stride = level_stride;
  }

  pyr->buffer_alloc =
      aom_memalign(PYRAMID_ALIGNMENT, buffer_size * sizeof(*pyr->buffer_alloc));
  if (!pyr->buffer_alloc) {
    aom_free(pyr->layers);
    aom_free(pyr);
    aom_free(layer_offsets);
    return NULL;
  }

  // Fill in pointers for each level
  // If image is 8-bit, then the lowest level is left unconfigured for now,
  // and will be set up properly when the pyramid is filled in
  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];
    layer->buffer = pyr->buffer_alloc + layer_offsets[level];
  }

#if CONFIG_MULTITHREAD
  pthread_mutex_init(&pyr->mutex, NULL);
#endif  // CONFIG_MULTITHREAD

  aom_free(layer_offsets);
  return pyr;
}